

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

void __thiscall Arg::print(Arg *this,ostream *o)

{
  Functor local_40;
  ostream *local_18;
  ostream *o_local;
  Arg *this_local;
  
  local_18 = o;
  o_local = (ostream *)this;
  if (this->tag == Functor) {
    Functor::Functor(&local_40,&this->f_);
    operator<<(o,&local_40);
    Functor::~Functor(&local_40);
  }
  else if (this->tag == Register) {
    operator<<(o,(Register)(this->r_).r);
  }
  return;
}

Assistant:

void print(std::ostream &o) const {
        switch(tag) {
            case ArgTag::Functor: o << f_; return;
            case ArgTag::Register: o << r_; return;
        }

    }